

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

void fill_string_pool(xmlChar **strings,char **seeds)

{
  int iVar1;
  xmlChar *pxVar2;
  int local_24;
  int start_ns;
  int k;
  int j;
  int i;
  char **seeds_local;
  xmlChar **strings_local;
  
  k = 0;
  while( true ) {
    if (seeds[k] == (char *)0x0) {
      start_ns = 0;
      local_24 = 0;
      while( true ) {
        if (89999 < k) {
          start_ns = 0;
          local_24 = 0;
          while( true ) {
            if (499 < start_ns || 99999 < k) {
              start_ns = 0;
              local_24 = 0;
              while( true ) {
                if (99999 < k) {
                  return;
                }
                pxVar2 = (xmlChar *)
                         xmlStrncatNew(strings[start_ns + 90000],strings[local_24],0xffffffff);
                strings[k] = pxVar2;
                if (strings[k] == (xmlChar *)0x0) break;
                start_ns = start_ns + 1;
                if (499 < start_ns) {
                  start_ns = 0;
                }
                local_24 = local_24 + 5;
                if (89999 < local_24) {
                  local_24 = 0;
                }
                k = k + 1;
              }
              fprintf(_stderr,"Out of memory while generating strings\n");
              exit(1);
            }
            pxVar2 = (xmlChar *)xmlStrncatNew(strings[local_24],":",0xffffffff);
            strings[k] = pxVar2;
            if (strings[k] == (xmlChar *)0x0) break;
            local_24 = local_24 + 1;
            if (89999 < local_24) {
              local_24 = 0;
            }
            k = k + 1;
            start_ns = start_ns + 1;
          }
          fprintf(_stderr,"Out of memory while generating strings\n");
          exit(1);
        }
        pxVar2 = (xmlChar *)xmlStrncatNew(strings[start_ns],strings[local_24],0xffffffff);
        strings[k] = pxVar2;
        if (strings[k] == (xmlChar *)0x0) break;
        iVar1 = xmlStrlen(strings[k]);
        if (0x1e < iVar1) {
          fprintf(_stderr,"### %s %s\n",strings[start_ns + 90000],strings[local_24]);
          abort();
        }
        start_ns = start_ns + 1;
        if (0x31 < start_ns) {
          start_ns = 0;
          local_24 = local_24 + 1;
        }
        k = k + 1;
      }
      fprintf(_stderr,"Out of memory while generating strings\n");
      exit(1);
    }
    pxVar2 = (xmlChar *)xmlStrdup(seeds[k]);
    strings[k] = pxVar2;
    if (strings[k] == (xmlChar *)0x0) break;
    k = k + 1;
  }
  fprintf(_stderr,"Out of memory while generating strings\n");
  exit(1);
}

Assistant:

static void
fill_string_pool(xmlChar **strings, const char **seeds) {
    int i, j, k;
    int start_ns = NB_STRINGS_MAX - NB_STRINGS_NS;

    /*
     * That's a bit nasty but the output is fine and it doesn't take hours
     * there is a small but sufficient number of duplicates, and we have
     * ":xxx" and full QNames in the last NB_STRINGS_NS values
     */
    for (i = 0; seeds[i] != NULL; i++) {
        strings[i] = xmlStrdup((const xmlChar *) seeds[i]);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
    }
    for (j = 0, k = 0; i < start_ns; i++) {
        strings[i] = xmlStrncatNew(strings[j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        if (xmlStrlen(strings[i]) > 30) {
            fprintf(stderr, "### %s %s\n", strings[start_ns+j], strings[k]);
            abort();
        }
        j++;
	if (j >= 50) {
	    j = 0;
	    k++;
	}
    }
    for (j = 0, k = 0; (j < NB_STRINGS_PREFIX) && (i < NB_STRINGS_MAX);
         i++, j++) {
        strings[i] = xmlStrncatNew(strings[k], (const xmlChar *) ":", -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        k += 1;
        if (k >= start_ns) k = 0;
    }
    for (j = 0, k = 0; i < NB_STRINGS_MAX; i++) {
        strings[i] = xmlStrncatNew(strings[start_ns+j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        j++;
        if (j >= NB_STRINGS_PREFIX) j = 0;
	k += 5;
        if (k >= start_ns) k = 0;
    }
}